

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printStatistics(Instance *instance)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  long in_RDI;
  Instance *in_stack_000000b0;
  Instance *in_stack_000000d0;
  
  bVar1 = Instance::solve(instance);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SAT");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"VSS: ");
    uVar2 = Instance::num_vss(in_stack_000000b0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"MAKESPAN: ");
    uVar2 = Instance::makespan(in_stack_000000d0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Sum Times: ");
    uVar2 = Instance::sum_times(in_stack_000000d0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"UNSAT");
    std::operator<<(poVar3,"\n");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"CONSTRAINT TIME: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 8));
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"SOLVE TIME: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x10));
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void printStatistics(Instance* instance) {
  if(instance->solve()) {
    std::cout << "SAT" << "\n";
    std::cout << "VSS: " << instance->num_vss() << "\n";
    std::cout << "MAKESPAN: " << instance->makespan() << "\n";
    std::cout << "Sum Times: " << instance->sum_times() << "\n";

  } else {
    std::cout << "UNSAT" << "\n";
  }
  std::cout << "CONSTRAINT TIME: " << instance->constraint_t << "\n";
  std::cout << "SOLVE TIME: " << instance->solve_t << "\n";
}